

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCnf.c
# Opt level: O0

void Fra_CnfNodeAddToSolver(Fra_Man_t *p,Aig_Obj_t *pOld,Aig_Obj_t *pNew)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *pVVar3;
  Aig_Obj_t *pAVar4;
  int local_48;
  int fUseMuxes;
  int k;
  int i;
  Aig_Obj_t *pFanin;
  Aig_Obj_t *pNode;
  Vec_Ptr_t *vFanins;
  Vec_Ptr_t *vFrontier;
  Aig_Obj_t *pNew_local;
  Aig_Obj_t *pOld_local;
  Fra_Man_t *p_local;
  
  if ((pOld == (Aig_Obj_t *)0x0) && (pNew == (Aig_Obj_t *)0x0)) {
    __assert_fail("pOld || pNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                  ,0xf3,"void Fra_CnfNodeAddToSolver(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (((pOld != (Aig_Obj_t *)0x0) && (pVVar2 = Fra_ObjFaninVec(pOld), pVVar2 == (Vec_Ptr_t *)0x0))
     || ((pNew != (Aig_Obj_t *)0x0 && (pVVar2 = Fra_ObjFaninVec(pNew), pVVar2 == (Vec_Ptr_t *)0x0)))
     ) {
    pVVar2 = Vec_PtrAlloc(100);
    if (pOld != (Aig_Obj_t *)0x0) {
      Fra_ObjAddToFrontier(p,pOld,pVVar2);
    }
    if (pNew != (Aig_Obj_t *)0x0) {
      Fra_ObjAddToFrontier(p,pNew,pVVar2);
    }
    for (fUseMuxes = 0; iVar1 = Vec_PtrSize(pVVar2), fUseMuxes < iVar1; fUseMuxes = fUseMuxes + 1) {
      pObj = (Aig_Obj_t *)Vec_PtrEntry(pVVar2,fUseMuxes);
      iVar1 = Fra_ObjSatNum(pObj);
      if (iVar1 == 0) {
        __assert_fail("Fra_ObjSatNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                      ,0xff,"void Fra_CnfNodeAddToSolver(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      pVVar3 = Fra_ObjFaninVec(pObj);
      if (pVVar3 != (Vec_Ptr_t *)0x0) {
        __assert_fail("Fra_ObjFaninVec(pNode) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                      ,0x100,"void Fra_CnfNodeAddToSolver(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      iVar1 = Aig_ObjIsMuxType(pObj);
      if (iVar1 == 0) {
        pNode = (Aig_Obj_t *)Fra_CollectSuper(pObj,1);
        for (local_48 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pNode), local_48 < iVar1;
            local_48 = local_48 + 1) {
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pNode,local_48);
          pAVar4 = Aig_Regular(pAVar4);
          Fra_ObjAddToFrontier(p,pAVar4,pVVar2);
        }
        Fra_AddClausesSuper(p,pObj,(Vec_Ptr_t *)pNode);
      }
      else {
        pNode = (Aig_Obj_t *)Vec_PtrAlloc(4);
        pAVar4 = Aig_ObjFanin0(pObj);
        pAVar4 = Aig_ObjFanin0(pAVar4);
        Vec_PtrPushUnique((Vec_Ptr_t *)pNode,pAVar4);
        pAVar4 = Aig_ObjFanin1(pObj);
        pAVar4 = Aig_ObjFanin0(pAVar4);
        Vec_PtrPushUnique((Vec_Ptr_t *)pNode,pAVar4);
        pAVar4 = Aig_ObjFanin0(pObj);
        pAVar4 = Aig_ObjFanin1(pAVar4);
        Vec_PtrPushUnique((Vec_Ptr_t *)pNode,pAVar4);
        pAVar4 = Aig_ObjFanin1(pObj);
        pAVar4 = Aig_ObjFanin1(pAVar4);
        Vec_PtrPushUnique((Vec_Ptr_t *)pNode,pAVar4);
        for (local_48 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pNode), local_48 < iVar1;
            local_48 = local_48 + 1) {
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pNode,local_48);
          pAVar4 = Aig_Regular(pAVar4);
          Fra_ObjAddToFrontier(p,pAVar4,pVVar2);
        }
        Fra_AddClausesMux(p,pObj);
      }
      iVar1 = Vec_PtrSize((Vec_Ptr_t *)pNode);
      if (iVar1 < 2) {
        __assert_fail("Vec_PtrSize(vFanins) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                      ,0x113,"void Fra_CnfNodeAddToSolver(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      Fra_ObjSetFaninVec(pObj,(Vec_Ptr_t *)pNode);
    }
    Vec_PtrFree(pVVar2);
  }
  return;
}

Assistant:

void Fra_CnfNodeAddToSolver( Fra_Man_t * p, Aig_Obj_t * pOld, Aig_Obj_t * pNew )
{ 
    Vec_Ptr_t * vFrontier, * vFanins;
    Aig_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    assert( pOld || pNew );
    // quit if CNF is ready
    if ( (!pOld || Fra_ObjFaninVec(pOld)) && (!pNew || Fra_ObjFaninVec(pNew)) )
        return;
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    if ( pOld ) Fra_ObjAddToFrontier( p, pOld, vFrontier );
    if ( pNew ) Fra_ObjAddToFrontier( p, pNew, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Aig_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Fra_ObjSatNum(pNode) );
        assert( Fra_ObjFaninVec(pNode) == NULL );
        if ( fUseMuxes && Aig_ObjIsMuxType(pNode) )
        {
            vFanins = Vec_PtrAlloc( 4 );
            Vec_PtrPushUnique( vFanins, Aig_ObjFanin0( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Aig_ObjFanin0( Aig_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( vFanins, Aig_ObjFanin1( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Aig_ObjFanin1( Aig_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Aig_Obj_t *, vFanins, pFanin, k )
                Fra_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Fra_AddClausesMux( p, pNode );
        }
        else
        {
            vFanins = Fra_CollectSuper( pNode, fUseMuxes );
            Vec_PtrForEachEntry( Aig_Obj_t *, vFanins, pFanin, k )
                Fra_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Fra_AddClausesSuper( p, pNode, vFanins );
        }
        assert( Vec_PtrSize(vFanins) > 1 );
        Fra_ObjSetFaninVec( pNode, vFanins );
    }
    Vec_PtrFree( vFrontier );
}